

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall QPDFArgParser::handleArgFileArguments(QPDFArgParser *this)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  element_type *peVar5;
  element_type *peVar6;
  size_t sVar7;
  size_type sVar8;
  __shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar9;
  element_type *ppcVar10;
  size_type local_100;
  ulong local_f8;
  size_t i_1;
  allocator<char> local_d9;
  string local_d8;
  shared_ptr<char> local_b8;
  shared_ptr<const_char> local_a8;
  allocator<char> local_91;
  string local_90;
  char *local_70;
  char *argfile;
  int i;
  allocator<char> local_51;
  string local_50;
  shared_ptr<char> local_30;
  shared_ptr<const_char> local_20;
  QPDFArgParser *local_10;
  QPDFArgParser *this_local;
  
  local_10 = this;
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar6 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  pcVar1 = *peVar6->argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar1,&local_51);
  QUtil::make_shared_cstr((QUtil *)&local_30,&local_50);
  std::shared_ptr<char_const>::shared_ptr<char,void>((shared_ptr<char_const> *)&local_20,&local_30);
  std::vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>::push_back
            (&peVar5->new_argv,(value_type *)&local_20);
  std::shared_ptr<const_char>::~shared_ptr(&local_20);
  std::shared_ptr<char>::~shared_ptr(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  for (argfile._0_4_ = 1; iVar4 = (int)argfile,
      peVar5 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this), iVar4 < peVar5->argc; argfile._0_4_ = (int)argfile + 1) {
    local_70 = (char *)0x0;
    peVar5 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    sVar7 = strlen(peVar5->argv[(int)argfile]);
    if ((1 < sVar7) &&
       (peVar5 = std::
                 __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this), *peVar5->argv[(int)argfile] == '@')) {
      peVar5 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      local_70 = peVar5->argv[(int)argfile] + 1;
      iVar4 = strcmp(local_70,"-");
      if ((iVar4 != 0) && (bVar3 = QUtil::file_can_be_opened(local_70), !bVar3)) {
        local_70 = (char *)0x0;
      }
    }
    if (local_70 == (char *)0x0) {
      peVar5 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar6 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      pcVar1 = peVar6->argv[(int)argfile];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar1,&local_d9);
      QUtil::make_shared_cstr((QUtil *)&local_b8,&local_d8);
      std::shared_ptr<char_const>::shared_ptr<char,void>
                ((shared_ptr<char_const> *)&local_a8,&local_b8);
      std::vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>::
      push_back(&peVar5->new_argv,(value_type *)&local_a8);
      std::shared_ptr<const_char>::~shared_ptr(&local_a8);
      std::shared_ptr<char>::~shared_ptr(&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
    }
    else {
      peVar5 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      pcVar1 = peVar5->argv[(int)argfile];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar1 + 1,&local_91);
      readArgsFromFile(this,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
    }
  }
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  sVar8 = std::vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>::
          size(&peVar5->new_argv);
  QUtil::make_shared_array<char_const*>((QUtil *)&i_1,sVar8 + 1);
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<const_char_*>::operator=(&peVar5->argv_ph,(shared_ptr<const_char_*> *)&i_1);
  std::shared_ptr<const_char_*>::~shared_ptr((shared_ptr<const_char_*> *)&i_1);
  local_f8 = 0;
  while( true ) {
    uVar2 = local_f8;
    peVar5 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    sVar8 = std::vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
            ::size(&peVar5->new_argv);
    if (sVar8 <= uVar2) break;
    peVar5 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    this_00 = &std::
               vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>::
               at(&peVar5->new_argv,local_f8)->
               super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>;
    peVar9 = std::__shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    peVar5 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    ppcVar10 = std::__shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(peVar5->argv_ph).
                           super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>);
    ppcVar10[local_f8] = peVar9;
    local_f8 = local_f8 + 1;
  }
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_100 = std::
              vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>::
              size(&peVar5->new_argv);
  iVar4 = QIntC::to_int<unsigned_long>(&local_100);
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->argc = iVar4;
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  ppcVar10 = std::__shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar5->argv_ph).
                         super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>);
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  ppcVar10[peVar5->argc] = (element_type)0x0;
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  ppcVar10 = std::__shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar5->argv_ph).
                         super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>);
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->argv = ppcVar10;
  return;
}

Assistant:

void
QPDFArgParser::handleArgFileArguments()
{
    // Support reading arguments from files. Create a new argv. Ensure that argv itself as well as
    // all its contents are automatically deleted by using shared pointers back to the pointers in
    // argv.
    m->new_argv.push_back(QUtil::make_shared_cstr(m->argv[0]));
    for (int i = 1; i < m->argc; ++i) {
        char const* argfile = nullptr;
        if ((strlen(m->argv[i]) > 1) && (m->argv[i][0] == '@')) {
            argfile = 1 + m->argv[i];
            if (strcmp(argfile, "-") != 0) {
                if (!QUtil::file_can_be_opened(argfile)) {
                    // The file's not there; treating as regular option
                    argfile = nullptr;
                }
            }
        }
        if (argfile) {
            readArgsFromFile(1 + m->argv[i]);
        } else {
            m->new_argv.push_back(QUtil::make_shared_cstr(m->argv[i]));
        }
    }
    m->argv_ph = QUtil::make_shared_array<char const*>(1 + m->new_argv.size());
    for (size_t i = 0; i < m->new_argv.size(); ++i) {
        m->argv_ph.get()[i] = m->new_argv.at(i).get();
    }
    m->argc = QIntC::to_int(m->new_argv.size());
    m->argv_ph.get()[m->argc] = nullptr;
    m->argv = m->argv_ph.get();
}